

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

ushort __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,SmallHeapBlockBitVector *free)

{
  code *pcVar1;
  anon_class_24_3_be079e9c fn;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  BVIndex BVar5;
  uint uVar6;
  undefined4 *puVar7;
  FreeObject *this_00;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_01;
  SmallHeapBlockBitVector *local_40;
  SmallHeapBlockBitVector *free_local;
  ushort freeCount;
  
  free->data[2].word = 0;
  free->data[3].word = 0;
  free->data[0].word = 0;
  free->data[1].word = 0;
  free_local._6_2_ = 0;
  this_00 = this->freeObjectList;
  local_40 = free;
  if (this_00 != (FreeObject *)0x0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      if (((ulong)this_00 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar2) goto LAB_006b32af;
        *puVar7 = 0;
      }
      uVar6 = (uint)((ulong)this_00 >> 4) & 0xff;
      bVar2 = IsValidBitIndex(this,uVar6);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x766,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar2) goto LAB_006b32af;
        *puVar7 = 0;
      }
      BVar3 = BVStatic<256UL>::Test(&this->debugFreeBits,uVar6);
      if (BVar3 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x767,"(this->GetDebugFreeBitVector()->Test(bitIndex))",
                           "this->GetDebugFreeBitVector()->Test(bitIndex)");
        if (!bVar2) goto LAB_006b32af;
        *puVar7 = 0;
      }
      BVStatic<256UL>::Set(local_40,uVar6);
      free_local._6_2_ = free_local._6_2_ + 1;
      this_00 = FreeObject::GetNext(this_00);
    } while (this_00 != (FreeObject *)0x0);
  }
  BVar5 = BVStatic<256UL>::Count(&this->debugFreeBits);
  if (BVar5 != free_local._6_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x76c,"(this->GetDebugFreeBitVector()->Count() == freeCount)",
                       "this->GetDebugFreeBitVector()->Count() == freeCount");
    if (!bVar2) goto LAB_006b32af;
    *puVar7 = 0;
  }
  uVar6 = (uint)(this->super_HeapBlock).heapBlockType;
  if ((uVar6 < 0xb) && ((0x528U >> (uVar6 & 0x1f) & 1) != 0)) {
    this_01 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>(&this->super_HeapBlock);
    fn.free = &local_40;
    fn.this = this;
    fn.freeCount = (ushort *)((long)&free_local + 6);
    SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
    ForEachPendingDisposeObject<Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::BuildFreeBitVector(BVStatic<256ul>*)::_lambda(unsigned_int)_1_>
              (this_01,fn);
    uVar4 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::
            AddDisposedObjectFreeBitVector(this_01,local_40);
    free_local._6_2_ = free_local._6_2_ + uVar4;
  }
  if (this->lastFreeCount < free_local._6_2_) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x77f,"(freeCount <= this->lastFreeCount)",
                       "freeCount <= this->lastFreeCount");
    if (!bVar2) {
LAB_006b32af:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  return free_local._6_2_;
}

Assistant:

ushort
SmallHeapBlockT<TBlockAttributes>::BuildFreeBitVector(SmallHeapBlockBitVector * free)
{
    free->ClearAll();
    ushort freeCount = 0;
    FreeObject * freeObject = this->freeObjectList;
    while (freeObject != nullptr)
    {
        uint bitIndex = GetAddressBitIndex(freeObject);
        Assert(IsValidBitIndex(bitIndex));
        Assert(this->GetDebugFreeBitVector()->Test(bitIndex));
        free->Set(bitIndex);
        freeCount++;
        freeObject = freeObject->GetNext();
    }
    Assert(this->GetDebugFreeBitVector()->Count() == freeCount);

    if (this->IsAnyFinalizableBlock())
    {
        auto finalizableBlock = this->AsFinalizableBlock<TBlockAttributes>();

        // Include pending dispose objects
        finalizableBlock->ForEachPendingDisposeObject([&] (uint index) {
            uint bitIndex = ((uint)index) * this->GetObjectBitDelta();
            Assert(IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            free->Set(bitIndex);
            freeCount++;
        });

        // Include disposed objects
        freeCount += finalizableBlock->AddDisposedObjectFreeBitVector(free);
    }

    Assert(freeCount <= this->lastFreeCount);
    return freeCount;
}